

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

String * __thiscall
Diligent::HLSL2GLSLConverterImpl::Convert_abi_cxx11_
          (String *__return_storage_ptr__,HLSL2GLSLConverterImpl *this,ConversionAttribs *Attribs)

{
  int iVar1;
  ConversionStream *this_00;
  string _msg;
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_e0;
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a8;
  vector<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType>_>
  local_70;
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  if (Attribs->ppConversionStream == (IHLSL2GLSLConversionStream **)0x0) {
    ConversionStream::ConversionStream
              ((ConversionStream *)&_msg,(IReferenceCounters *)0x0,this,Attribs->InputFileName,
               Attribs->pSourceStreamFactory,Attribs->HLSLSource,Attribs->NumSymbols,false);
    ConversionStream::Convert_abi_cxx11_
              (__return_storage_ptr__,(ConversionStream *)&_msg,Attribs->EntryPoint,
               Attribs->ShaderType,Attribs->IncludeDefinitions,Attribs->SamplerSuffix,
               Attribs->UseInOutLocationQualifiers,Attribs->UseRowMajorMatrices);
    _msg._M_dataplus._M_p = "6S9";
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_p != &local_38) {
      operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
    }
    std::
    vector<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType>_>
    ::~vector(&local_70);
    std::
    _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_a8);
    std::
    _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_e0);
    std::__cxx11::
    _List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
    ::_M_clear((_List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                *)&_msg.field_2);
  }
  else {
    this_00 = (ConversionStream *)*Attribs->ppConversionStream;
    if (this_00 != (ConversionStream *)0x0) {
      CheckDynamicType<Diligent::HLSL2GLSLConverterImpl::ConversionStream,Diligent::IHLSL2GLSLConversionStream>
                ((IHLSL2GLSLConversionStream *)this_00);
      iVar1 = std::__cxx11::string::compare((char *)&this_00->m_InputFileName);
      if (iVar1 != 0) {
        FormatString<char[46],std::__cxx11::string,char[61],char_const*,char[30]>
                  (&_msg,(Diligent *)"Input stream was initialized for input file \"",
                   (char (*) [46])&this_00->m_InputFileName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\" that does not match the name of the file to be converted \"",
                   (char (*) [61])&Attribs->InputFileName,(char **)"\". New stream will be created",
                   (char (*) [30])_msg._M_dataplus._M_p);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_msg._M_dataplus._M_p != &_msg.field_2) {
          operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
        }
        (*((*Attribs->ppConversionStream)->super_IObject)._vptr_IObject[2])();
        *Attribs->ppConversionStream = (IHLSL2GLSLConversionStream *)0x0;
      }
    }
    if (*Attribs->ppConversionStream == (IHLSL2GLSLConversionStream *)0x0) {
      CreateStream(this,Attribs->InputFileName,Attribs->pSourceStreamFactory,Attribs->HLSLSource,
                   Attribs->NumSymbols,Attribs->ppConversionStream);
      this_00 = (ConversionStream *)*Attribs->ppConversionStream;
      CheckDynamicType<Diligent::HLSL2GLSLConverterImpl::ConversionStream,Diligent::IHLSL2GLSLConversionStream>
                ((IHLSL2GLSLConversionStream *)this_00);
    }
    ConversionStream::Convert_abi_cxx11_
              (__return_storage_ptr__,this_00,Attribs->EntryPoint,Attribs->ShaderType,
               Attribs->IncludeDefinitions,Attribs->SamplerSuffix,
               Attribs->UseInOutLocationQualifiers,Attribs->UseRowMajorMatrices);
  }
  return __return_storage_ptr__;
}

Assistant:

String HLSL2GLSLConverterImpl::Convert(ConversionAttribs& Attribs) const
{
    if (Attribs.ppConversionStream == nullptr)
    {
        try
        {
            ConversionStream Stream(nullptr, *this, Attribs.InputFileName, Attribs.pSourceStreamFactory, Attribs.HLSLSource, Attribs.NumSymbols, false);
            return Stream.Convert(Attribs.EntryPoint, Attribs.ShaderType, Attribs.IncludeDefinitions,
                                  Attribs.SamplerSuffix, Attribs.UseInOutLocationQualifiers,
                                  Attribs.UseRowMajorMatrices);
        }
        catch (std::runtime_error&)
        {
            return "";
        }
    }
    else
    {
        ConversionStream* pStream = nullptr;
        if (*Attribs.ppConversionStream != nullptr)
        {
            pStream = ClassPtrCast<ConversionStream>(*Attribs.ppConversionStream);

            const auto& FileNameFromStream = pStream->GetInputFileName();
            if (FileNameFromStream != Attribs.InputFileName)
            {
                LOG_WARNING_MESSAGE("Input stream was initialized for input file \"", FileNameFromStream, "\" that does not match the name of the file to be converted \"", Attribs.InputFileName, "\". New stream will be created");
                (*Attribs.ppConversionStream)->Release();
                *Attribs.ppConversionStream = nullptr;
            }
        }

        if (*Attribs.ppConversionStream == nullptr)
        {
            CreateStream(Attribs.InputFileName, Attribs.pSourceStreamFactory, Attribs.HLSLSource, Attribs.NumSymbols, Attribs.ppConversionStream);
            pStream = ClassPtrCast<ConversionStream>(*Attribs.ppConversionStream);
        }

        return pStream->Convert(Attribs.EntryPoint, Attribs.ShaderType, Attribs.IncludeDefinitions,
                                Attribs.SamplerSuffix, Attribs.UseInOutLocationQualifiers,
                                Attribs.UseRowMajorMatrices);
    }
}